

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cpp
# Opt level: O0

MaybeResult<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_> *
wasm::WATParser::anon_unknown_22::maybeAction
          (MaybeResult<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_>
           *__return_storage_ptr__,Lexer *in)

{
  __index_type *__return_storage_ptr___00;
  bool bVar1;
  Literals *pLVar2;
  Name *pNVar3;
  basic_string_view<char,_std::char_traits<char>_> bVar4;
  _Storage<wasm::Name,_true> local_300;
  size_t local_2e8;
  char *local_2e0;
  allocator<char> local_2d1;
  string local_2d0;
  Err local_2b0;
  allocator<char> local_289;
  string local_288;
  Err local_268;
  undefined1 local_248 [8];
  optional<wasm::Name> name_1;
  optional<wasm::Name> id_1;
  _Storage<wasm::Name,_true> local_208;
  size_t local_1f0;
  char *pcStack_1e8;
  Literals local_1e0;
  allocator<char> local_1a1;
  string local_1a0;
  Err local_180;
  uint local_15c;
  Err local_158;
  Err *local_138;
  Err *err;
  Result<wasm::Literals> _val;
  Result<wasm::Literals> args;
  allocator<char> local_99;
  string local_98;
  Err local_78;
  undefined1 local_58 [8];
  optional<wasm::Name> name;
  optional<wasm::Name> id;
  Lexer *in_local;
  
  bVar4 = sv("invoke",6);
  bVar1 = Lexer::takeSExprStart(in,bVar4);
  if (bVar1) {
    Lexer::takeID((optional<wasm::Name> *)
                  &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                   super__Optional_payload_base<wasm::Name>._M_engaged,in);
    Lexer::takeName((optional<wasm::Name> *)local_58,in);
    bVar1 = std::optional::operator_cast_to_bool((optional *)local_58);
    if (bVar1) {
      __return_storage_ptr___00 =
           (__index_type *)
           ((long)&_val.val.super__Variant_base<wasm::Literals,_wasm::Err>.
                   super__Move_assign_alias<wasm::Literals,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Literals,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Literals,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Literals,_wasm::Err> + 0x38);
      consts((Result<wasm::Literals> *)__return_storage_ptr___00,in);
      Result<wasm::Literals>::Result
                ((Result<wasm::Literals> *)&err,(Result<wasm::Literals> *)__return_storage_ptr___00)
      ;
      local_138 = Result<wasm::Literals>::getErr((Result<wasm::Literals> *)&err);
      bVar1 = local_138 != (Err *)0x0;
      if (bVar1) {
        wasm::Err::Err(&local_158,local_138);
        MaybeResult<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_>::
        MaybeResult(__return_storage_ptr__,&local_158);
        wasm::Err::~Err(&local_158);
      }
      local_15c = (uint)bVar1;
      Result<wasm::Literals>::~Result((Result<wasm::Literals> *)&err);
      if (local_15c == 0) {
        bVar1 = Lexer::takeRParen(in);
        if (bVar1) {
          local_208._M_value.super_IString.str._M_len =
               name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Name>._16_8_;
          pNVar3 = std::optional<wasm::Name>::operator*((optional<wasm::Name> *)local_58);
          local_1f0 = (pNVar3->super_IString).str._M_len;
          pcStack_1e8 = (pNVar3->super_IString).str._M_str;
          pLVar2 = Result<wasm::Literals>::operator*
                             ((Result<wasm::Literals> *)
                              ((long)&_val.val.super__Variant_base<wasm::Literals,_wasm::Err>.
                                      super__Move_assign_alias<wasm::Literals,_wasm::Err>.
                                      super__Copy_assign_alias<wasm::Literals,_wasm::Err>.
                                      super__Move_ctor_alias<wasm::Literals,_wasm::Err>.
                                      super__Copy_ctor_alias<wasm::Literals,_wasm::Err> + 0x38));
          Literals::Literals(&local_1e0,pLVar2);
          MaybeResult<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_>::
          MaybeResult<wasm::WATParser::InvokeAction>
                    (__return_storage_ptr__,(InvokeAction *)&local_208._M_value);
          InvokeAction::~InvokeAction((InvokeAction *)&local_208._M_value);
          local_15c = 1;
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1a0,"expected end of invoke action",&local_1a1);
          Lexer::err(&local_180,in,&local_1a0);
          MaybeResult<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_>::
          MaybeResult(__return_storage_ptr__,&local_180);
          wasm::Err::~Err(&local_180);
          std::__cxx11::string::~string((string *)&local_1a0);
          std::allocator<char>::~allocator(&local_1a1);
          local_15c = 1;
        }
      }
      Result<wasm::Literals>::~Result
                ((Result<wasm::Literals> *)
                 ((long)&_val.val.super__Variant_base<wasm::Literals,_wasm::Err>.
                         super__Move_assign_alias<wasm::Literals,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Literals,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Literals,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Literals,_wasm::Err> + 0x38));
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"expected export name",&local_99);
      Lexer::err(&local_78,in,&local_98);
      MaybeResult<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_>::
      MaybeResult(__return_storage_ptr__,&local_78);
      wasm::Err::~Err(&local_78);
      std::__cxx11::string::~string((string *)&local_98);
      std::allocator<char>::~allocator(&local_99);
    }
  }
  else {
    bVar4 = sv("get",3);
    bVar1 = Lexer::takeSExprStart(in,bVar4);
    if (bVar1) {
      Lexer::takeID((optional<wasm::Name> *)
                    &name_1.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                     super__Optional_payload_base<wasm::Name>._M_engaged,in);
      Lexer::takeName((optional<wasm::Name> *)local_248,in);
      bVar1 = std::optional::operator_cast_to_bool((optional *)local_248);
      if (bVar1) {
        bVar1 = Lexer::takeRParen(in);
        if (bVar1) {
          local_300._M_value.super_IString.str._M_len =
               name_1.super__Optional_base<wasm::Name,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Name>._16_8_;
          pNVar3 = std::optional<wasm::Name>::operator*((optional<wasm::Name> *)local_248);
          local_2e8 = (pNVar3->super_IString).str._M_len;
          local_2e0 = (pNVar3->super_IString).str._M_str;
          MaybeResult<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_>::
          MaybeResult<wasm::WATParser::GetAction>
                    (__return_storage_ptr__,(GetAction *)&local_300._M_value);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2d0,"expected end of get action",&local_2d1);
          Lexer::err(&local_2b0,in,&local_2d0);
          MaybeResult<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_>::
          MaybeResult(__return_storage_ptr__,&local_2b0);
          wasm::Err::~Err(&local_2b0);
          std::__cxx11::string::~string((string *)&local_2d0);
          std::allocator<char>::~allocator(&local_2d1);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_288,"expected export name",&local_289);
        Lexer::err(&local_268,in,&local_288);
        MaybeResult<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_>::
        MaybeResult(__return_storage_ptr__,&local_268);
        wasm::Err::~Err(&local_268);
        std::__cxx11::string::~string((string *)&local_288);
        std::allocator<char>::~allocator(&local_289);
      }
    }
    else {
      MaybeResult<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_>::
      MaybeResult(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<Action> maybeAction(Lexer& in) {
  if (in.takeSExprStart("invoke"sv)) {
    auto id = in.takeID();
    auto name = in.takeName();
    if (!name) {
      return in.err("expected export name");
    }
    auto args = consts(in);
    CHECK_ERR(args);
    if (!in.takeRParen()) {
      return in.err("expected end of invoke action");
    }
    return InvokeAction{id, *name, *args};
  }

  if (in.takeSExprStart("get"sv)) {
    auto id = in.takeID();
    auto name = in.takeName();
    if (!name) {
      return in.err("expected export name");
    }
    if (!in.takeRParen()) {
      return in.err("expected end of get action");
    }
    return GetAction{id, *name};
  }

  return {};
}